

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_cube_texture
               (rf_texture2d texture,rf_vec3 position,float width,float height,float length,
               rf_color color)

{
  _Bool _Var1;
  float fVar2;
  float z;
  float y;
  float x;
  float length_local;
  float height_local;
  float width_local;
  rf_color color_local;
  undefined4 local_14;
  undefined4 uStack_10;
  rf_vec3 position_local;
  
  fVar2 = position.z;
  local_14 = position.x;
  uStack_10 = position.y;
  _Var1 = rf_gfx_check_buffer_limit(0x24);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_enable_texture(texture.id);
  rf_gfx_begin(RF_QUADS);
  height_local._0_1_ = color.r;
  height_local._1_1_ = color.g;
  height_local._2_1_ = color.b;
  height_local._3_1_ = color.a;
  rf_gfx_color4ub(height_local._0_1_,height_local._1_1_,height_local._2_1_,height_local._3_1_);
  rf_gfx_normal3f(0.0,0.0,1.0);
  rf_gfx_tex_coord2f(0.0,0.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 - height / 2.0,fVar2 + length / 2.0);
  rf_gfx_tex_coord2f(1.0,0.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 - height / 2.0,fVar2 + length / 2.0);
  rf_gfx_tex_coord2f(1.0,1.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 + height / 2.0,fVar2 + length / 2.0);
  rf_gfx_tex_coord2f(0.0,1.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 + height / 2.0,fVar2 + length / 2.0);
  rf_gfx_normal3f(0.0,0.0,-1.0);
  rf_gfx_tex_coord2f(1.0,0.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 - height / 2.0,fVar2 - length / 2.0);
  rf_gfx_tex_coord2f(1.0,1.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 + height / 2.0,fVar2 - length / 2.0);
  rf_gfx_tex_coord2f(0.0,1.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 + height / 2.0,fVar2 - length / 2.0);
  rf_gfx_tex_coord2f(0.0,0.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 - height / 2.0,fVar2 - length / 2.0);
  rf_gfx_normal3f(0.0,1.0,0.0);
  rf_gfx_tex_coord2f(0.0,1.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 + height / 2.0,fVar2 - length / 2.0);
  rf_gfx_tex_coord2f(0.0,0.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 + height / 2.0,fVar2 + length / 2.0);
  rf_gfx_tex_coord2f(1.0,0.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 + height / 2.0,fVar2 + length / 2.0);
  rf_gfx_tex_coord2f(1.0,1.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 + height / 2.0,fVar2 - length / 2.0);
  rf_gfx_normal3f(0.0,-1.0,0.0);
  rf_gfx_tex_coord2f(1.0,1.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 - height / 2.0,fVar2 - length / 2.0);
  rf_gfx_tex_coord2f(0.0,1.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 - height / 2.0,fVar2 - length / 2.0);
  rf_gfx_tex_coord2f(0.0,0.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 - height / 2.0,fVar2 + length / 2.0);
  rf_gfx_tex_coord2f(1.0,0.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 - height / 2.0,fVar2 + length / 2.0);
  rf_gfx_normal3f(1.0,0.0,0.0);
  rf_gfx_tex_coord2f(1.0,0.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 - height / 2.0,fVar2 - length / 2.0);
  rf_gfx_tex_coord2f(1.0,1.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 + height / 2.0,fVar2 - length / 2.0);
  rf_gfx_tex_coord2f(0.0,1.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 + height / 2.0,fVar2 + length / 2.0);
  rf_gfx_tex_coord2f(0.0,0.0);
  rf_gfx_vertex3f(local_14 + width / 2.0,uStack_10 - height / 2.0,fVar2 + length / 2.0);
  rf_gfx_normal3f(-1.0,0.0,0.0);
  rf_gfx_tex_coord2f(0.0,0.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 - height / 2.0,fVar2 - length / 2.0);
  rf_gfx_tex_coord2f(1.0,0.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 - height / 2.0,fVar2 + length / 2.0);
  rf_gfx_tex_coord2f(1.0,1.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 + height / 2.0,fVar2 + length / 2.0);
  rf_gfx_tex_coord2f(0.0,1.0);
  rf_gfx_vertex3f(local_14 - width / 2.0,uStack_10 + height / 2.0,fVar2 - length / 2.0);
  rf_gfx_end();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_cube_texture(rf_texture2d texture, rf_vec3 position, float width, float height, float length, rf_color color)
{
    float x = position.x;
    float y = position.y;
    float z = position.z;

    if (rf_gfx_check_buffer_limit(36)) rf_gfx_draw();

    rf_gfx_enable_texture(texture.id);

    //rf_gfx_push_matrix();
    // NOTE: Transformation is applied in inverse order (scale -> rotate -> translate)
    //rf_gfx_translatef(2.0f, 0.0f, 0.0f);
    //rf_gfx_rotatef(45, 0, 1, 0);
    //rf_gfx_scalef(2.0f, 2.0f, 2.0f);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    // Front Face
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f); // Normal Pointing Towards Viewer
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Top Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Left Of The rf_texture and Quad
    // Back Face
    rf_gfx_normal3f(0.0f, 0.0f, - 1.0f); // Normal Pointing Away From Viewer
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Bottom Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Left Of The rf_texture and Quad
    // Top Face
    rf_gfx_normal3f(0.0f, 1.0f, 0.0f); // Normal Pointing Up
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Bottom Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Bottom Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Right Of The rf_texture and Quad
    // Bottom Face
    rf_gfx_normal3f(0.0f, - 1.0f, 0.0f); // Normal Pointing Down
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Top Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Top Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Right Of The rf_texture and Quad
    // Right face
    rf_gfx_normal3f(1.0f, 0.0f, 0.0f); // Normal Pointing Right
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Top Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Left Of The rf_texture and Quad
    // Left Face
    rf_gfx_normal3f(-1.0f, 0.0f, 0.0f); // Normal Pointing Left
    rf_gfx_tex_coord2f(0.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Bottom Left Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 0.0f); rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(1.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Right Of The rf_texture and Quad
    rf_gfx_tex_coord2f(0.0f, 1.0f); rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left Of The rf_texture and Quad
    rf_gfx_end();
    //rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}